

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ListReader *pLVar1;
  ElementSize EVar2;
  ushort uVar3;
  ElementCount EVar4;
  PointerReader other;
  StructReader other_00;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  undefined8 extraout_RAX;
  byte bVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  word *pwVar11;
  uint i_1;
  ulong unaff_RBX;
  word *__dest;
  uint i_2;
  uint uVar12;
  ElementCount index;
  uint uVar13;
  ElementSize EVar14;
  uint uVar15;
  ulong uVar16;
  undefined2 uVar17;
  ulong uVar18;
  long lVar19;
  ListReader *__begin3;
  AllocateResult AVar20;
  AllocateResult AVar21;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  uint local_fc;
  ulong local_f8;
  uint local_f0;
  OrphanBuilder *local_e8;
  Exception *local_e0;
  uint local_d0;
  long local_c0;
  Fault local_b8;
  undefined1 local_b0 [32];
  uint local_90;
  ushort local_8c;
  uint local_84;
  SegmentReader *local_80;
  CapTableReader *pCStack_78;
  byte *local_70;
  int iStack_68;
  undefined4 uStack_64;
  StructReader local_60;
  
  uVar16 = CONCAT71(in_register_00000009,elementSize) & 0xffffffff;
  local_b0._0_8_ = lists.size_;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffff00000000;
  local_b0._16_8_ = " > ";
  local_b0._24_8_ = (WirePointer *)0x4;
  local_90 = CONCAT31(local_90._1_3_,lists.size_ != 0);
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[25]>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd8d,FAILED,"lists.size() > 0","_kjCondition,\"Can\'t concat empty list \"",
               (DebugComparison<unsigned_long,_int> *)local_b0,
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  lVar19 = lists.size_ * 0x30;
  pLVar1 = lists.ptr + lists.size_;
  uVar18 = (ulong)(uint)structSize;
  uVar13 = (uint)structSize >> 0x10;
  lVar8 = 0;
  uVar12 = 0;
  do {
    uVar17 = (undefined2)uVar18;
    uVar15 = (uint)uVar16;
    uVar12 = uVar12 + *(int *)((long)&(lists.ptr)->elementCount + lVar8);
    if (0x1fffffff < uVar12) {
      concat::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)__return_storage_ptr__)
      ;
      goto LAB_00195252;
    }
    EVar2 = (&(lists.ptr)->elementSize)[lVar8];
    EVar14 = (ElementSize)uVar16;
    if (EVar2 != EVar14) {
      local_b8.exception._0_1_ = EVar14 != BIT && EVar2 != BIT;
      if (EVar14 == BIT || EVar2 == BIT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[40]>
                  ((Fault *)local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xd97,FAILED,
                   "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                   "_kjCondition,\"can\'t upgrade bit lists to struct lists\"",(bool *)&local_b8,
                   (char (*) [40])"can\'t upgrade bit lists to struct lists");
        kj::_::Debug::Fault::fatal((Fault *)local_b0);
      }
      uVar16 = CONCAT71((int7)(uVar16 >> 8),7);
    }
    uVar15 = (uint)uVar16;
    uVar10 = uVar18 & 0xffff;
    uVar18 = (ulong)*(uint *)((long)&(lists.ptr)->structDataSize + lVar8) + 0x3f >> 6;
    if (uVar18 <= uVar10) {
      uVar18 = uVar10;
    }
    uVar17 = (undefined2)uVar18;
    uVar3 = *(ushort *)((long)&(lists.ptr)->structPointerCount + lVar8);
    if ((ushort)uVar13 <= uVar3) {
      uVar13 = (uint)uVar3;
    }
    lVar8 = lVar8 + 0x30;
  } while (lVar19 != lVar8);
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  local_d0 = uVar15 & 0xff;
  local_e8 = __return_storage_ptr__;
  local_c0 = lVar19;
  if ((char)uVar16 == '\a') {
    local_f0 = (uint)uVar18 & 0xffff;
    local_f8._0_4_ = uVar13 + ((uint)uVar18 & 0xffff);
    unaff_RBX = (ulong)(uint)local_f8 * (ulong)uVar12;
    local_fc = uVar13;
    if (0x1ffffffe < unaff_RBX) {
LAB_00195252:
      WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)local_b0);
    }
    if (arena == (BuilderArena *)0x0) goto LAB_001952fc;
    AVar21 = BuilderArena::allocate(arena,(int)unaff_RBX + 1);
    pwVar11 = AVar21.words;
    *(undefined4 *)&(local_e8->tag).content = 0xfffffffd;
    *(int *)((long)&(local_e8->tag).content + 4) = (int)unaff_RBX * 8 + 7;
    *(uint *)&pwVar11->content = uVar12 * 4;
    *(undefined2 *)((long)&pwVar11->content + 4) = uVar17;
    *(ushort *)((long)&pwVar11->content + 6) = (ushort)local_fc;
    AVar20.words = pwVar11 + 1;
    AVar20.segment = AVar21.segment;
    local_f8 = (ulong)((uint)local_f8 << 6);
    uVar13 = local_f0 << 6;
  }
  else {
    if (arena == (BuilderArena *)0x0) {
LAB_001952fc:
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)local_e8);
      kj::_::Debug::Fault::~Fault(&local_b8);
      _Unwind_Resume(extraout_RAX);
    }
    uVar13 = *(uint *)((long)&BITS_PER_ELEMENT_TABLE + (ulong)(local_d0 * 4));
    local_f8 = (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + local_d0 * 4);
    AVar20 = BuilderArena::allocate(arena,(SegmentWordCount)(uVar12 * local_f8 + 0x3f >> 6));
    local_fc._0_2_ = (ushort)((char)uVar16 == '\x06');
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar12 * 8 | local_d0;
  }
  pwVar11 = AVar20.words;
  local_e0 = (Exception *)AVar20.segment;
  local_84 = uVar15;
  if ((char)uVar15 == '\a') {
    iVar7 = 0;
    do {
      EVar4 = (lists.ptr)->elementCount;
      if (EVar4 != 0) {
        index = 0;
        do {
          local_b0._16_8_ = (long)&pwVar11->content + ((iVar7 + index) * local_f8 >> 3);
          local_b0._0_8_ = local_e0;
          local_b0._24_8_ =
               (long)&(((WirePointer *)local_b0._16_8_)->offsetAndKind).value + (ulong)(uVar13 >> 3)
          ;
          local_b0._8_8_ = capTable;
          local_90 = uVar13;
          local_8c = (ushort)local_fc;
          ListReader::getStructElement(&local_60,lists.ptr,index);
          other_00.capTable = local_60.capTable;
          other_00.segment = local_60.segment;
          other_00.data = local_60.data;
          other_00.pointers = local_60.pointers;
          other_00.dataSize = local_60.dataSize;
          other_00.pointerCount = local_60.pointerCount;
          other_00._38_2_ = local_60._38_2_;
          other_00.nestingLimit = local_60.nestingLimit;
          other_00._44_4_ = local_60._44_4_;
          StructBuilder::copyContentFrom((StructBuilder *)local_b0,other_00);
          index = index + 1;
        } while (EVar4 != index);
        iVar7 = iVar7 + index;
      }
      lists.ptr = lists.ptr + 1;
    } while (lists.ptr != pLVar1);
  }
  else if (local_d0 == 6) {
    iVar7 = 0;
    do {
      uVar13 = (lists.ptr)->elementCount;
      if ((ulong)uVar13 != 0) {
        uVar16 = 0;
        do {
          local_b0._16_8_ = (long)&pwVar11->content + ((uint)((int)uVar16 + iVar7) * local_f8 >> 3);
          local_b0._0_8_ = local_e0;
          local_80 = (lists.ptr)->segment;
          pCStack_78 = (lists.ptr)->capTable;
          uVar5 = (lists.ptr)->segment;
          uVar6 = (lists.ptr)->capTable;
          other.capTable = (CapTableReader *)uVar6;
          other.segment = (SegmentReader *)uVar5;
          local_70 = (lists.ptr)->ptr +
                     ((lists.ptr)->step * uVar16 >> 3) + (ulong)((lists.ptr)->structDataSize >> 3);
          iStack_68 = (lists.ptr)->nestingLimit;
          other._28_4_ = uStack_64;
          other.nestingLimit = iStack_68;
          other.pointer = (WirePointer *)local_70;
          local_b0._8_8_ = capTable;
          PointerBuilder::copyFrom((PointerBuilder *)local_b0,other,false);
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
        iVar7 = iVar7 + (int)uVar16;
      }
      lists.ptr = lists.ptr + 1;
    } while (lists.ptr != pLVar1);
  }
  else if (local_d0 == 1) {
    iVar7 = 0;
    do {
      uVar13 = (lists.ptr)->elementCount;
      if (uVar13 != 0) {
        uVar16 = 0;
        do {
          uVar12 = (uint)uVar16;
          uVar18 = (ulong)(iVar7 + uVar12 >> 3);
          bVar9 = (byte)(iVar7 + uVar12) & 7;
          *(byte *)((long)&pwVar11->content + uVar18) =
               (((lists.ptr)->ptr[uVar16 >> 3] >> (uVar12 & 7) & 1) != 0) << bVar9 |
               *(byte *)((long)&pwVar11->content + uVar18) & ~(byte)(1 << bVar9);
          uVar12 = uVar12 + 1;
          uVar16 = (ulong)uVar12;
        } while (uVar13 != uVar12);
        iVar7 = iVar7 + uVar12;
      }
      lists.ptr = lists.ptr + 1;
    } while (lists.ptr != pLVar1);
  }
  else {
    lVar19 = 0;
    __dest = pwVar11;
    do {
      uVar16 = (ulong)*(uint *)((long)&(lists.ptr)->elementCount + lVar19) * (local_f8 >> 3);
      if ((int)uVar16 != 0) {
        memcpy(__dest,*(void **)((long)&(lists.ptr)->ptr + lVar19),uVar16 & 0xffffffff);
      }
      __dest = (word *)((long)&__dest->content + uVar16);
      lVar19 = lVar19 + 0x30;
    } while (local_c0 != lVar19);
  }
  local_e8->segment = (SegmentBuilder *)local_e0;
  local_e8->capTable = capTable;
  local_e8->location = pwVar11 + ((ulong)(pwVar11 == (word *)0x0 || (char)local_84 != '\a') - 1);
  return local_e8;
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}